

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureSpecificationTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::TexSubImageCubeArrayDepthCase::createTexture
          (TexSubImageCubeArrayDepthCase *this)

{
  ContextWrapper *this_00;
  deUint32 dVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int xoffset;
  int zoffset;
  TransferFormat TVar5;
  int iVar6;
  int ndx;
  int iVar7;
  deUint32 tex;
  ContextWrapper *local_d8;
  ulong local_d0;
  TransferFormat local_c8;
  ulong local_c0;
  Vec4 local_b8;
  Vec4 local_a8;
  PixelBufferAccess local_90;
  TextureLevel levelData;
  Random rnd;
  
  TVar5 = glu::getTransferFormat((this->super_TextureCubeArraySpecCase).m_texFormat);
  dVar1 = deStringHash((this->super_TextureCubeArraySpecCase).super_TextureSpecCase.super_TestCase.
                       super_TestCase.super_TestNode.m_name._M_dataplus._M_p);
  deRandom_init(&rnd.m_rnd,dVar1);
  tex = 0;
  local_d0 = (ulong)TVar5 >> 0x20;
  local_c8 = TVar5;
  local_90.super_ConstPixelBufferAccess.m_format =
       glu::mapGLTransferFormat(TVar5.format,TVar5.dataType);
  tcu::TextureLevel::TextureLevel(&levelData,(TextureFormat *)&local_90);
  this_00 = &(this->super_TextureCubeArraySpecCase).super_TextureSpecCase.super_ContextWrapper;
  sglr::ContextWrapper::glGenTextures(this_00,1,&tex);
  sglr::ContextWrapper::glBindTexture(this_00,0x9009,tex);
  sglr::ContextWrapper::glPixelStorei(this_00,0xcf5,1);
  dVar1 = sglr::ContextWrapper::glGetError(this_00);
  iVar7 = 0;
  glu::checkError(dVar1,(char *)0x0,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureSpecificationTests.cpp"
                  ,0x295);
  local_d8 = this_00;
  while( true ) {
    iVar6 = (this->super_TextureCubeArraySpecCase).m_numLevels;
    if (iVar6 <= iVar7) break;
    iVar6 = (this->super_TextureCubeArraySpecCase).m_size >> ((byte)iVar7 & 0x1f);
    if (iVar6 < 2) {
      iVar6 = 1;
    }
    local_a8.m_data[0] = -1.5;
    local_a8.m_data[1] = -2.0;
    local_a8.m_data[2] = 1.7;
    local_a8.m_data[3] = -1.5;
    local_b8.m_data[0] = 2.0;
    local_b8.m_data[1] = 1.5;
    local_b8.m_data[2] = -1.0;
    local_b8.m_data[3] = 2.0;
    tcu::TextureLevel::setSize
              (&levelData,iVar6,iVar6,(this->super_TextureCubeArraySpecCase).m_depth);
    tcu::TextureLevel::getAccess(&local_90,&levelData);
    tcu::fillWithComponentGradients(&local_90,&local_a8,&local_b8);
    iVar3 = (this->super_TextureCubeArraySpecCase).m_depth;
    iVar4 = *(int *)&(this->super_TextureCubeArraySpecCase).field_0xd4;
    tcu::TextureLevel::getAccess(&local_90,&levelData);
    sglr::ContextWrapper::glTexImage3D
              (local_d8,0x9009,iVar7,iVar4,iVar6,iVar6,iVar3,0,local_c8.format,(deUint32)local_d0,
               local_90.super_ConstPixelBufferAccess.m_data);
    iVar7 = iVar7 + 1;
  }
  for (iVar7 = 0; iVar7 < iVar6; iVar7 = iVar7 + 1) {
    iVar6 = (this->super_TextureCubeArraySpecCase).m_size >> ((byte)iVar7 & 0x1f);
    if (iVar6 < 2) {
      iVar6 = 1;
    }
    uVar2 = de::Random::getInt((Random *)&rnd.m_rnd,1,iVar6);
    iVar3 = de::Random::getInt((Random *)&rnd.m_rnd,1,iVar6);
    iVar4 = de::Random::getInt((Random *)&rnd.m_rnd,1,(this->super_TextureCubeArraySpecCase).m_depth
                              );
    xoffset = de::Random::getInt((Random *)&rnd.m_rnd,0,iVar6 - uVar2);
    local_c0 = (ulong)uVar2;
    iVar6 = de::Random::getInt((Random *)&rnd.m_rnd,0,iVar6 - iVar3);
    zoffset = de::Random::getInt((Random *)&rnd.m_rnd,0,
                                 (this->super_TextureCubeArraySpecCase).m_depth - iVar4);
    local_a8.m_data[0] = 2.0;
    local_a8.m_data[1] = 1.5;
    local_a8.m_data[2] = -1.0;
    local_a8.m_data[3] = 2.0;
    local_b8.m_data[0] = -1.5;
    local_b8.m_data[1] = -2.0;
    local_b8.m_data[2] = 1.7;
    local_b8.m_data[3] = -1.5;
    dVar1 = deRandom_getUint32(&rnd.m_rnd);
    tcu::TextureLevel::setSize(&levelData,(int)local_c0,iVar3,iVar4);
    tcu::TextureLevel::getAccess(&local_90,&levelData);
    tcu::fillWithGrid(&local_90,dVar1 % 0xf + 2,&local_a8,&local_b8);
    tcu::TextureLevel::getAccess(&local_90,&levelData);
    sglr::ContextWrapper::glTexSubImage3D
              (local_d8,0x9009,iVar7,xoffset,iVar6,zoffset,(int)local_c0,iVar3,iVar4,local_c8.format
               ,(deUint32)local_d0,local_90.super_ConstPixelBufferAccess.m_data);
    iVar6 = (this->super_TextureCubeArraySpecCase).m_numLevels;
  }
  tcu::TextureLevel::~TextureLevel(&levelData);
  return;
}

Assistant:

void createTexture (void)
	{
		glu::TransferFormat	fmt			= glu::getTransferFormat(m_texFormat);
		de::Random			rnd			(deStringHash(getName()));
		deUint32			tex			= 0;
		tcu::TextureLevel	levelData	(glu::mapGLTransferFormat(fmt.format, fmt.dataType));

		glGenTextures(1, &tex);
		glBindTexture(GL_TEXTURE_CUBE_MAP_ARRAY, tex);
		glPixelStorei(GL_UNPACK_ALIGNMENT, 1);
		GLU_CHECK();

		// First specify full texture.
		for (int ndx = 0; ndx < m_numLevels; ndx++)
		{
			const int   levelW		= de::max(1, m_size >> ndx);
			const Vec4  gMin		= Vec4(-1.5f, -2.0f, 1.7f, -1.5f);
			const Vec4  gMax		= Vec4(2.0f, 1.5f, -1.0f, 2.0f);

			levelData.setSize(levelW, levelW, m_depth);
			tcu::fillWithComponentGradients(levelData.getAccess(), gMin, gMax);

			glTexImage3D(GL_TEXTURE_CUBE_MAP_ARRAY, ndx, m_internalFormat, levelW, levelW, m_depth, 0, fmt.format, fmt.dataType, levelData.getAccess().getDataPtr());
		}

		// Re-specify parts of each level.
		for (int ndx = 0; ndx < m_numLevels; ndx++)
		{
			const int	levelW		= de::max(1, m_size >> ndx);

			const int	w			= rnd.getInt(1, levelW);
			const int	h			= rnd.getInt(1, levelW);
			const int	d			= rnd.getInt(1, m_depth);
			const int	x			= rnd.getInt(0, levelW-w);
			const int	y			= rnd.getInt(0, levelW-h);
			const int	z			= rnd.getInt(0, m_depth-d);

			const Vec4	colorA		= Vec4(2.0f, 1.5f, -1.0f, 2.0f);
			const Vec4	colorB		= Vec4(-1.5f, -2.0f, 1.7f, -1.5f);
			const int	cellSize	= rnd.getInt(2, 16);

			levelData.setSize(w, h, d);
			tcu::fillWithGrid(levelData.getAccess(), cellSize, colorA, colorB);

			glTexSubImage3D(GL_TEXTURE_CUBE_MAP_ARRAY, ndx, x, y, z, w, h, d, fmt.format, fmt.dataType, levelData.getAccess().getDataPtr());
		}
	}